

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

void __thiscall Bstrlib::String::String(String *this,VerySimpleReadOnlyString *b)

{
  uint uVar1;
  uchar *puVar2;
  size_t __n;
  
  (this->super_tagbstring).mlen = 0;
  (this->super_tagbstring).slen = 0;
  (this->super_tagbstring).data = (uchar *)0x0;
  uVar1 = b->length;
  if (-1 < (int)uVar1) {
    (this->super_tagbstring).mlen = (int)((ulong)uVar1 + 1);
    (this->super_tagbstring).slen = uVar1;
    puVar2 = (uchar *)malloc((ulong)uVar1 + 1);
    (this->super_tagbstring).data = puVar2;
  }
  puVar2 = (this->super_tagbstring).data;
  if (puVar2 != (uchar *)0x0) {
    __n = (size_t)(this->super_tagbstring).slen;
    if ((0 < (long)__n) && (b->data != (tCharPtr)0x0)) {
      memcpy(puVar2,b->data,__n);
    }
    (this->super_tagbstring).data[(this->super_tagbstring).slen] = '\0';
    return;
  }
  (this->super_tagbstring).mlen = 0;
  (this->super_tagbstring).slen = 0;
  fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
          "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
          ,0xcd,"Failure in block constructor");
  return;
}

Assistant:

String::String(const Strings::VerySimpleReadOnlyString & b)
    {
        slen = mlen = 0; data = 0;
        if (b.getLength() >= 0)
        {
            mlen = b.getLength() + 1;
            slen = b.getLength();
            data = (uint8 * ) malloc(mlen);
        }
        if (!data)
        {
            mlen = slen = 0;
            bstringThrow("Failure in block constructor");
        }
        else
        {
            if (slen > 0 && b.getData())    memcpy(data, b.getData(), slen);
            data[slen] = '\0';
        }
    }